

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binjgb.c
# Opt level: O0

void toggle_layer(Layer layer)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 local_30 [8];
  EmulatorConfig emu_config;
  Layer layer_local;
  
  emu_config.allow_simulataneous_dpad_opposites = layer;
  emulator_get_config((EmulatorConfig *)local_30,e);
  if (emu_config.allow_simulataneous_dpad_opposites == FALSE) {
    emu_config.disable_sound[2] = emu_config.disable_sound[2] ^ TRUE;
  }
  else if (emu_config.allow_simulataneous_dpad_opposites == TRUE) {
    emu_config.disable_sound[3] = emu_config.disable_sound[3] ^ TRUE;
  }
  else if (emu_config.allow_simulataneous_dpad_opposites == 2) {
    emu_config.disable_bg = emu_config.disable_bg ^ TRUE;
  }
  emulator_set_config(e,(EmulatorConfig *)local_30);
  pcVar3 = "bg";
  if (emu_config.disable_sound[2] != FALSE) {
    pcVar3 = "__";
  }
  pcVar2 = "win";
  if (emu_config.disable_sound[3] != FALSE) {
    pcVar2 = "___";
  }
  pcVar1 = "obj";
  if (emu_config.disable_bg != FALSE) {
    pcVar1 = "___";
  }
  set_status_text("Layer: %s %s %s",pcVar3,pcVar2,pcVar1);
  return;
}

Assistant:

static void toggle_layer(Layer layer) {
  EmulatorConfig emu_config = emulator_get_config(e);
  switch (layer) {
    case LAYER_BG: emu_config.disable_bg ^= 1; break;
    case LAYER_WINDOW: emu_config.disable_window ^= 1; break;
    case LAYER_OBJ: emu_config.disable_obj ^= 1; break;
  }
  emulator_set_config(e, &emu_config);
  set_status_text("Layer: %s %s %s", emu_config.disable_bg ? "__" : "bg",
                  emu_config.disable_window ? "___" : "win",
                  emu_config.disable_obj ? "___" : "obj");
}